

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O2

uint64_t __thiscall
Imf_3_4::Compressor::runDecodeStep
          (Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  exr_decode_pipeline_t *peVar1;
  element_type p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint64_t uVar5;
  int iVar6;
  char *pcVar7;
  pointer pcVar8;
  ArgExc *this_00;
  ulong uVar9;
  exr_chunk_info_t cinfo;
  
  if (inSize == 0) {
    pcVar7 = (this->_memory_buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
             _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if (pcVar7 == (char *)0x0) {
      uVar9 = (long)this->_numScanLines * this->_maxScanLineSize;
      this->_buf_sz = uVar9;
      pcVar8 = (pointer)operator_new__(uVar9);
      std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->_memory_buffer,pcVar8
                );
      pcVar7 = (this->_memory_buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>
               ._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
    }
    *outPtr = pcVar7;
    return 0;
  }
  cinfo.sample_count_data_offset = 0;
  cinfo.sample_count_table_size = 0;
  cinfo.packed_size = 0;
  cinfo.unpacked_size = 0;
  cinfo.width = 0;
  cinfo.level_x = '\0';
  cinfo.level_y = '\0';
  cinfo.type = '\0';
  cinfo.compression = '\0';
  cinfo.data_offset = 0;
  cinfo.idx = 0;
  cinfo.start_x = 0;
  cinfo.start_y = 0;
  cinfo.height = 0;
  iVar6 = exr_chunk_default_initialize
                    (*(this->_ctxt)._ctxt.
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
                     ,range,this->_levelX,this->_levelY);
  if (iVar6 == 0) {
    if (((this->_store_type & ~EXR_STORAGE_TILED) == EXR_STORAGE_DEEP_SCANLINE) &&
       (cinfo.unpacked_size = this->_expectedSize, cinfo.unpacked_size == 0)) {
      cinfo.unpacked_size = this->_maxScanLineSize;
    }
    cinfo.packed_size = (uint64_t)inSize;
    cinfo.type = (uint8_t)this->_store_type;
    if (this->_buf_sz < cinfo.unpacked_size) {
      uVar9 = (long)this->_numScanLines * this->_maxScanLineSize;
      if (uVar9 < cinfo.unpacked_size || uVar9 - cinfo.unpacked_size == 0) {
        uVar9 = cinfo.unpacked_size;
      }
      this->_buf_sz = uVar9;
      pcVar8 = (pointer)operator_new__(uVar9);
      std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->_memory_buffer,pcVar8
                );
    }
    p_Var2 = *(this->_ctxt)._ctxt.
              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1 = &this->_decoder;
    if (this->_decoder_init == false) {
      iVar6 = exr_decoding_initialize(p_Var2,0,&cinfo,peVar1);
      if (iVar6 != 0) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to initialize decoder type");
        goto LAB_00161a42;
      }
      this->_decoder_init = true;
    }
    else {
      iVar6 = exr_decoding_update(p_Var2,0,&cinfo,peVar1);
      if (iVar6 != 0) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to update decoder");
        goto LAB_00161a42;
      }
    }
    (this->_decoder).packed_buffer = inPtr;
    uVar3 = *(undefined4 *)
             ((long)&(this->_memory_buffer)._M_t.
                     super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl + 4);
    uVar5 = this->_buf_sz;
    uVar4 = *(undefined4 *)((long)&this->_buf_sz + 4);
    *(undefined4 *)&(this->_decoder).unpacked_buffer =
         *(undefined4 *)
          &(this->_memory_buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
           _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
    *(undefined4 *)((long)&(this->_decoder).unpacked_buffer + 4) = uVar3;
    *(int *)&(this->_decoder).unpacked_alloc_size = (int)uVar5;
    *(undefined4 *)((long)&(this->_decoder).unpacked_alloc_size + 4) = uVar4;
    iVar6 = exr_uncompress_chunk(peVar1);
    (this->_decoder).packed_buffer = (void *)0x0;
    (this->_decoder).unpacked_buffer = (void *)0x0;
    (this->_decoder).unpacked_alloc_size = 0;
    *outPtr = (this->_memory_buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
              _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if (iVar6 == 0) {
      return (this->_decoder).bytes_decompressed;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"Unable to run compression routine");
  }
  else {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"Unable to initialize chunk information");
  }
LAB_00161a42:
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

uint64_t
Compressor::runDecodeStep (
    const char* inPtr,
    int inSize,
    IMATH_NAMESPACE::Box2i range,
    const char*& outPtr)
{
    // special case
    if (inSize == 0)
    {
        if (!_memory_buffer)
        {
            _buf_sz = _maxScanLineSize * _numScanLines;
            _memory_buffer.reset (new char[_buf_sz]);
        }
        outPtr = _memory_buffer.get ();
        return 0;
    }

    exr_result_t rv;
    exr_chunk_info_t cinfo = {0};
    uint64_t expectedOutputSize;

    if (EXR_ERR_SUCCESS != exr_chunk_default_initialize (
            _ctxt, 0, (const exr_attr_box2i_t*) &range, _levelX, _levelY, &cinfo))
        throw IEX_NAMESPACE::ArgExc ("Unable to initialize chunk information");

    if (_store_type == EXR_STORAGE_DEEP_SCANLINE ||
        _store_type == EXR_STORAGE_DEEP_TILED)
    {
        if (_expectedSize != 0)
        {
            expectedOutputSize = _expectedSize;
            cinfo.unpacked_size = _expectedSize;
        }
        else
        {
            expectedOutputSize = _maxScanLineSize;
            cinfo.unpacked_size = _maxScanLineSize;
        }
    }
    else
    {
        expectedOutputSize = cinfo.unpacked_size;
    }

    cinfo.packed_size = inSize;
    cinfo.type = _store_type;
    if (_buf_sz < expectedOutputSize)
    {
        uint64_t fullbuf = _maxScanLineSize * _numScanLines;
        _buf_sz = std::max (fullbuf, expectedOutputSize);
        _memory_buffer.reset (new char[_buf_sz]);
    }

    if (!_decoder_init)
    {
        if (EXR_ERR_SUCCESS != exr_decoding_initialize(_ctxt, 0, &cinfo, &_decoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to initialize decoder type");

        _decoder_init = true;
    }
    else
    {
        if (EXR_ERR_SUCCESS != exr_decoding_update(_ctxt, 0, &cinfo, &_decoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to update decoder");
    }

//    if (_store_type == EXR_STORAGE_DEEP_SCANLINE ||
//        _store_type == EXR_STORAGE_DEEP_TILED)
//    {
//        _decoder.decode_flags |= EXR_DECODE_ALLOW_SHORT_DECODE;
//    }

    _decoder.packed_buffer = const_cast<char*> (inPtr);
    _decoder.unpacked_buffer = _memory_buffer.get();
    _decoder.unpacked_alloc_size = _buf_sz;

    rv = exr_uncompress_chunk(&_decoder);

    _decoder.packed_buffer   = nullptr;
    _decoder.unpacked_buffer = nullptr;
    _decoder.unpacked_alloc_size = 0;

    outPtr = _memory_buffer.get ();

    if (EXR_ERR_SUCCESS != rv)
        throw IEX_NAMESPACE::ArgExc ("Unable to run compression routine");

    return _decoder.bytes_decompressed;
}